

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vswprint.c
# Opt level: O1

int vswprintf_s(char16_t_conflict *string,size_t sizeInWords,char16_t_conflict *format,
               __va_list_tag *ap)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  unsigned_long uVar4;
  int iVar5;
  size_t __n;
  char *pcVar6;
  __va_list_tag *in_R8;
  ulong uVar7;
  
  if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 && format == (char16_t_conflict *)0x0) {
    (*sMBUSafeCRTAssertFunc)
              ("\"format != NULL\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
               ,0x93);
  }
  if (format == (char16_t_conflict *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
      return -1;
    }
    pcVar6 = "\"format != NULL\"";
    uVar4 = 0x93;
  }
  else {
    if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 &&
        (sizeInWords == 0 || string == (char16_t_conflict *)0x0)) {
      (*sMBUSafeCRTAssertFunc)
                ("\"string != NULL && sizeInWords > 0\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                 ,0x94);
    }
    if (sizeInWords != 0 && string != (char16_t_conflict *)0x0) {
      iVar1 = _vswprintf_helper((WOUTPUTFN)string,(char16_t_conflict *)sizeInWords,(size_t)format,
                                (char16_t_conflict *)ap,in_R8);
      if (((iVar1 < 0) && (*string = 0, 2 < sizeInWords + 1)) && (sizeInWords != 0x7fffffff)) {
        iVar5 = 8;
        if (sizeInWords - 1 < 8) {
          iVar5 = (int)(sizeInWords - 1);
        }
        memset(string + 1,0xfd,(ulong)(uint)(iVar5 * 2));
      }
      if (iVar1 != -2) {
        if (iVar1 < 0) {
          return iVar1;
        }
        if (sizeInWords == 0xffffffffffffffff) {
          return iVar1;
        }
        if (sizeInWords == 0x7fffffff) {
          return iVar1;
        }
        uVar3 = (ulong)(iVar1 + 1);
        uVar7 = sizeInWords - uVar3;
        if (sizeInWords < uVar3 || uVar7 == 0) {
          return iVar1;
        }
        __n = 0x10;
        if (uVar7 < 9) {
          __n = uVar7 * 2;
        }
        memset(string + uVar3,0xfd,__n);
        return iVar1;
      }
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                   ,0x9e);
      }
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      pcVar6 = "\"(\\\"Buffer too small\\\" && 0)\"";
      uVar4 = 0x9e;
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      pcVar6 = "\"string != NULL && sizeInWords > 0\"";
      uVar4 = 0x94;
    }
  }
  (*sMBUSafeCRTAssertFunc)
            (pcVar6,"SafeCRT assert failed",
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
             ,uVar4);
  return -1;
}

Assistant:

int __cdecl _vswprintf_s (
        char16_t *string,
        size_t sizeInWords,
        const char16_t *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInWords > 0, EINVAL, -1);

    retvalue = _vswprintf_helper(_woutput_s, string, sizeInWords, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInWords, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInWords, retvalue + 1);
    }

    return retvalue;
}